

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-not-readable-nor-writable-on-read-error.c
# Opt level: O0

int run_test_not_readable_nor_writable_on_read_error(void)

{
  int iVar1;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in sa;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-not-readable-nor-writable-on-read-error.c"
            ,0x56,"uv_ip4_addr(\"127.0.0.1\", 9123, &sa)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_loop_init(&loop);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-not-readable-nor-writable-on-read-error.c"
            ,0x57,"uv_loop_init(&loop)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_tcp_init(&loop,&tcp_client);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-not-readable-nor-writable-on-read-error.c"
            ,0x58,"uv_tcp_init(&loop, &tcp_client)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_tcp_connect(&connect_req,&tcp_client,&eval_a,connect_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-not-readable-nor-writable-on-read-error.c"
            ,0x5d,
            "uv_tcp_connect(&connect_req, &tcp_client, (const struct sockaddr*) &sa, connect_cb)",
            "==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_run(&loop,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-not-readable-nor-writable-on-read-error.c"
            ,0x5f,"uv_run(&loop, UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)connect_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-not-readable-nor-writable-on-read-error.c"
            ,0x61,"1","==","connect_cb_called",1,"==",(long)connect_cb_called);
    abort();
  }
  if ((long)read_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-not-readable-nor-writable-on-read-error.c"
            ,0x62,"1","==","read_cb_called",1,"==",(long)read_cb_called);
    abort();
  }
  if ((long)write_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-not-readable-nor-writable-on-read-error.c"
            ,99,"1","==","write_cb_called",1,"==",(long)write_cb_called);
    abort();
  }
  if ((long)close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-not-readable-nor-writable-on-read-error.c"
            ,100,"1","==","close_cb_called",1,"==",(long)close_cb_called);
    abort();
  }
  close_loop(&loop);
  iVar1 = uv_loop_close(&loop);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-not-readable-nor-writable-on-read-error.c"
            ,0x66,"0","==","uv_loop_close(&loop)",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(not_readable_nor_writable_on_read_error) {
  struct sockaddr_in sa;
  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &sa));
  ASSERT_OK(uv_loop_init(&loop));
  ASSERT_OK(uv_tcp_init(&loop, &tcp_client));

  ASSERT_OK(uv_tcp_connect(&connect_req,
                           &tcp_client,
                           (const struct sockaddr*) &sa,
                           connect_cb));

  ASSERT_OK(uv_run(&loop, UV_RUN_DEFAULT));

  ASSERT_EQ(1, connect_cb_called);
  ASSERT_EQ(1, read_cb_called);
  ASSERT_EQ(1, write_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(&loop);
  return 0;
}